

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O3

void __thiscall llvm::FoldingSetBase::clear(FoldingSetBase *this)

{
  memset(this->Buckets,0,(ulong)this->NumBuckets << 3);
  this->Buckets[this->NumBuckets] = (void *)0xffffffffffffffff;
  this->NumNodes = 0;
  return;
}

Assistant:

void FoldingSetBase::clear() {
  // Set all but the last bucket to null pointers.
  memset(Buckets, 0, NumBuckets*sizeof(void*));

  // Set the very last bucket to be a non-null "pointer".
  Buckets[NumBuckets] = reinterpret_cast<void*>(-1);

  // Reset the node count to zero.
  NumNodes = 0;
}